

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O1

QualifiedIdentifier * __thiscall
soul::PoolAllocator::
allocate<soul::AST::QualifiedIdentifier,soul::AST::Context&,soul::IdentifierPath>
          (PoolAllocator *this,Context *args,IdentifierPath *args_1)

{
  ulong uVar1;
  PoolItem *pPVar2;
  size_t sVar3;
  IdentifierPath local_78;
  
  pPVar2 = allocateSpaceForObject(this,0xa0);
  local_78.pathSections.numAllocated = 8;
  uVar1 = (args_1->pathSections).numAllocated;
  if (uVar1 < 9) {
    local_78.pathSections.items = (Identifier *)local_78.pathSections.space;
    local_78.pathSections.numActive = (args_1->pathSections).numActive;
    if (local_78.pathSections.numActive != 0) {
      sVar3 = 0;
      do {
        ((uint64_t *)local_78.pathSections.items)[sVar3] =
             (uint64_t)(args_1->pathSections).items[sVar3].name;
        sVar3 = sVar3 + 1;
      } while (local_78.pathSections.numActive != sVar3);
    }
  }
  else {
    local_78.pathSections.items = (args_1->pathSections).items;
    local_78.pathSections.numActive = (args_1->pathSections).numActive;
    (args_1->pathSections).items = (Identifier *)(args_1->pathSections).space;
    (args_1->pathSections).numAllocated = 8;
    (args_1->pathSections).numActive = 0;
    local_78.pathSections.numAllocated = uVar1;
  }
  AST::QualifiedIdentifier::QualifiedIdentifier((QualifiedIdentifier *)&pPVar2->item,args,&local_78)
  ;
  local_78.pathSections.numActive = 0;
  if ((8 < local_78.pathSections.numAllocated) && (local_78.pathSections.items != (Identifier *)0x0)
     ) {
    operator_delete__(local_78.pathSections.items);
  }
  pPVar2->destructor =
       allocate<soul::AST::QualifiedIdentifier,_soul::AST::Context_&,_soul::IdentifierPath>::
       anon_class_1_0_00000001::__invoke;
  return (QualifiedIdentifier *)&pPVar2->item;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }